

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O2

btVectorXf * __thiscall
btLemkeAlgorithm::solve(btVectorXf *__return_storage_ptr__,btLemkeAlgorithm *this,uint maxloops)

{
  float fVar1;
  uint rows;
  float *pfVar2;
  btVectorXf *pbVar3;
  float fVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  float *pfVar8;
  undefined4 uVar9;
  ulong uVar10;
  uint pivotRowIndex;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  btLemkeAlgorithm *this_00;
  btLemkeAlgorithm *pbVar14;
  btAlignedObjectArray<int> *basis_00;
  ulong uVar15;
  uint uVar16;
  float fVar17;
  uint local_180;
  uint local_17c;
  ulong local_178;
  btLemkeAlgorithm *local_170;
  btVectorXf *local_168;
  uint local_15c;
  btAlignedObjectArray<int> basis;
  btMatrixXf A;
  btMatrixXf ident;
  btMatrixXf mNeg;
  
  *(undefined4 *)(this + 0x80) = 0;
  rows = *(uint *)(this + 100);
  uVar11 = (long)(int)rows * 2;
  local_178 = uVar11 & 0xffffffff;
  btVectorX<float>::btVectorX(__return_storage_ptr__,(uint)uVar11);
  local_168 = __return_storage_ptr__;
  btVectorX<float>::setZero(__return_storage_ptr__);
  btMatrixX<float>::btMatrixX(&ident,rows,rows);
  btMatrixX<float>::setIdentity(&ident);
  btMatrixX<float>::negative(&mNeg,(btMatrixX<float> *)(this + 8));
  local_17c = maxloops;
  local_170 = this;
  btMatrixX<float>::btMatrixX(&A,rows,(int)local_178 + 2);
  iVar12 = rows - 1;
  btMatrixX<float>::setSubMatrix(&A,0,0,iVar12,iVar12,&ident);
  btMatrixX<float>::setSubMatrix(&A,0,rows,iVar12,(int)local_178 + -1,&mNeg);
  btMatrixX<float>::setSubMatrix(&A,0,(int)local_178,iVar12,(int)local_178,-1.0);
  uVar15 = uVar11 & 0xffffffff | 1;
  btMatrixX<float>::setSubMatrix
            (&A,0,(uint)uVar11 | 1,iVar12,(int)uVar15,(btVectorX<float> *)(local_170 + 0x60));
  basis.m_ownsMemory = true;
  basis.m_data = (int *)0x0;
  basis.m_size = 0;
  basis.m_capacity = 0;
  for (local_180 = 0; (int)local_180 < (int)rows; local_180 = local_180 + 1) {
    btAlignedObjectArray<int>::push_back(&basis,(int *)&local_180);
  }
  lVar7 = (long)A.m_cols;
  uVar10 = 0;
  uVar13 = 0;
  if (0 < (int)rows) {
    uVar13 = (ulong)rows;
  }
  this_00 = (btLemkeAlgorithm *)(A.m_storage.m_data + (uVar11 | 1));
  basis_00 = (btAlignedObjectArray<int> *)CONCAT71((int7)(uVar15 >> 8),1);
  fVar17 = 1e+30;
  uVar11 = 0xffffffffffffffff;
  for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
    fVar1 = *(float *)this_00;
    if (fVar1 < fVar17) {
      uVar11 = uVar10;
    }
    uVar11 = uVar11 & 0xffffffff;
    fVar4 = fVar1;
    if (fVar17 <= fVar1) {
      fVar4 = fVar17;
    }
    fVar17 = fVar4;
    basis_00 = (btAlignedObjectArray<int> *)
               CONCAT71((int7)((ulong)basis_00 >> 8),(byte)basis_00 & 0.0 <= fVar1);
    this_00 = this_00 + lVar7 * 4;
  }
  pbVar14 = local_170;
  if (((ulong)basis_00 & 1) == 0) {
    uVar16 = 100;
    if (local_17c != 0) {
      uVar16 = local_17c;
    }
    local_15c = -rows;
    uVar15 = local_178 & 0xffffffff;
    pivotRowIndex = (uint)uVar11;
    uVar11 = uVar11 & 0xffffffff;
    uVar6 = 0;
    local_17c = uVar16;
    while (pbVar14 = local_170, *(uint *)(local_170 + 0x80) = uVar6, uVar6 < local_17c) {
      iVar12 = (int)uVar11;
      GaussJordanEliminationStep(this_00,&A,iVar12,(int)uVar15,basis_00);
      uVar16 = local_15c;
      if (basis.m_data[iVar12] < (int)rows) {
        uVar16 = rows;
      }
      uVar16 = uVar16 + basis.m_data[iVar12];
      basis.m_data[iVar12] = (int)uVar15;
      local_180 = uVar16;
      uVar6 = findLexicographicMinimum(pbVar14,&A,(int *)&local_180);
      uVar11 = (ulong)uVar6;
      if (pivotRowIndex == uVar6) {
        GaussJordanEliminationStep(pbVar14,&A,pivotRowIndex,uVar16,basis_00);
        basis.m_data[(int)pivotRowIndex] = uVar16;
        this_00 = pbVar14;
        break;
      }
      uVar15 = (ulong)uVar16;
      this_00 = pbVar14;
      uVar6 = *(int *)(local_170 + 0x80) + 1;
    }
    pbVar14 = local_170;
    bVar5 = validBasis(this_00,&basis);
    if (!bVar5) {
      uVar9 = 0xffffffff;
      goto LAB_001990f3;
    }
    lVar7 = (long)A.m_cols;
  }
  pfVar2 = (local_168->m_storage).m_data;
  uVar9 = 0;
  uVar11 = basis._4_8_ & 0xffffffff;
  if (basis.m_size < 1) {
    uVar11 = 0;
  }
  pfVar8 = A.m_storage.m_data + (long)(int)local_178 + 1;
  for (uVar15 = 0; uVar11 != uVar15; uVar15 = uVar15 + 1) {
    pfVar2[basis.m_data[uVar15]] = *pfVar8;
    pfVar8 = pfVar8 + lVar7;
  }
LAB_001990f3:
  pbVar3 = local_168;
  *(undefined4 *)(pbVar14 + 0x88) = uVar9;
  btAlignedObjectArray<int>::~btAlignedObjectArray(&basis);
  btMatrixX<float>::~btMatrixX(&A);
  btMatrixX<float>::~btMatrixX(&mNeg);
  btMatrixX<float>::~btMatrixX(&ident);
  return pbVar3;
}

Assistant:

btVectorXu btLemkeAlgorithm::solve(unsigned int maxloops /* = 0*/)
{
  
    
    steps = 0;

    int dim = m_q.size();
#ifdef BT_DEBUG_OSTREAM
    if(DEBUGLEVEL >= 1) {
      cout << "Dimension = " << dim << endl;
    }
#endif //BT_DEBUG_OSTREAM

	btVectorXu solutionVector(2 * dim);
	solutionVector.setZero();
	  
	  //, INIT, 0.);

	btMatrixXu ident(dim, dim);
	ident.setIdentity();
#ifdef BT_DEBUG_OSTREAM
	cout << m_M << std::endl;
#endif

	btMatrixXu mNeg = m_M.negative();
	  
    btMatrixXu A(dim, 2 * dim + 2);
	//
	A.setSubMatrix(0, 0, dim - 1, dim - 1,ident);
	A.setSubMatrix(0, dim, dim - 1, 2 * dim - 1,mNeg);
	A.setSubMatrix(0, 2 * dim, dim - 1, 2 * dim, -1.f);
	A.setSubMatrix(0, 2 * dim + 1, dim - 1, 2 * dim + 1,m_q);

#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //BT_DEBUG_OSTREAM


 //   btVectorXu q_;
 //   q_ >> A(0, 2 * dim + 1, dim - 1, 2 * dim + 1);

    btAlignedObjectArray<int> basis;
    //At first, all w-values are in the basis
    for (int i = 0; i < dim; i++)
      basis.push_back(i);

	int pivotRowIndex = -1;
	btScalar minValue = 1e30f;
	bool greaterZero = true;
	for (int i=0;i<dim;i++)
	{
		btScalar v =A(i,2*dim+1);
		if (v<minValue)
		{
			minValue=v;
			pivotRowIndex = i;
		}
		if (v<0)
			greaterZero = false;
	}
	

	
  //  int pivotRowIndex = q_.minIndex();//minIndex(q_);     // first row is that with lowest q-value
    int z0Row = pivotRowIndex;           // remember the col of z0 for ending algorithm afterwards
    int pivotColIndex = 2 * dim;         // first col is that of z0

#ifdef BT_DEBUG_OSTREAM
    if (DEBUGLEVEL >= 3)
	{
    //  cout << "A: " << A << endl;
      cout << "pivotRowIndex " << pivotRowIndex << endl;
      cout << "pivotColIndex " << pivotColIndex << endl;
      cout << "Basis: ";
      for (int i = 0; i < basis.size(); i++)
        cout << basis[i] << " ";
      cout << endl;
    }
#endif //BT_DEBUG_OSTREAM

	if (!greaterZero)
	{

      if (maxloops == 0) {
		  maxloops = 100;
//        maxloops = UINT_MAX; //TODO: not a really nice way, problem is: maxloops should be 2^dim (=1<<dim), but this could exceed UINT_MAX and thus the result would be 0 and therefore the lemke algorithm wouldn't start but probably would find a solution within less then UINT_MAX steps. Therefore this constant is used as a upper border right now...
      }

      /*start looping*/
      for(steps = 0; steps < maxloops; steps++) {

        GaussJordanEliminationStep(A, pivotRowIndex, pivotColIndex, basis);
#ifdef BT_DEBUG_OSTREAM
        if (DEBUGLEVEL >= 3) {
        //  cout << "A: " << A << endl;
          cout << "pivotRowIndex " << pivotRowIndex << endl;
          cout << "pivotColIndex " << pivotColIndex << endl;
          cout << "Basis: ";
          for (int i = 0; i < basis.size(); i++)
            cout << basis[i] << " ";
          cout << endl;
        }
#endif //BT_DEBUG_OSTREAM

        int pivotColIndexOld = pivotColIndex;

        /*find new column index */
        if (basis[pivotRowIndex] < dim) //if a w-value left the basis get in the correspondent z-value
          pivotColIndex = basis[pivotRowIndex] + dim;
        else
          //else do it the other way round and get in the corresponding w-value
          pivotColIndex = basis[pivotRowIndex] - dim;

        /*the column becomes part of the basis*/
        basis[pivotRowIndex] = pivotColIndexOld;

        pivotRowIndex = findLexicographicMinimum(A, pivotColIndex);

        if(z0Row == pivotRowIndex) { //if z0 leaves the basis the solution is found --> one last elimination step is necessary
          GaussJordanEliminationStep(A, pivotRowIndex, pivotColIndex, basis);
          basis[pivotRowIndex] = pivotColIndex; //update basis
          break;
      }

      }
#ifdef BT_DEBUG_OSTREAM
      if(DEBUGLEVEL >= 1) {
        cout << "Number of loops: " << steps << endl;
        cout << "Number of maximal loops: " << maxloops << endl;
      }
#endif //BT_DEBUG_OSTREAM

      if(!validBasis(basis)) {
        info = -1;
#ifdef BT_DEBUG_OSTREAM
        if(DEBUGLEVEL >= 1)
          cerr << "Lemke-Algorithm ended with Ray-Termination (no valid solution)." << endl;
#endif //BT_DEBUG_OSTREAM

        return solutionVector;
      }

    }
#ifdef BT_DEBUG_OSTREAM
    if (DEBUGLEVEL >= 2) {
     // cout << "A: " << A << endl;
      cout << "pivotRowIndex " << pivotRowIndex << endl;
      cout << "pivotColIndex " << pivotColIndex << endl;
    }
#endif //BT_DEBUG_OSTREAM

    for (int i = 0; i < basis.size(); i++)
	{
      solutionVector[basis[i]] = A(i,2*dim+1);//q_[i];
	}

    info = 0;

    return solutionVector;
  }